

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

Privkey * cfd::core::Privkey::FromWif
                    (Privkey *__return_storage_ptr__,string *wif,NetType net_type,bool is_compressed
                    )

{
  uchar uVar1;
  bool bVar2;
  int iVar3;
  CfdException *pCVar4;
  allocator local_fd;
  int ret;
  size_t uncompressed;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> privkey;
  size_t written;
  KeyFormatData format_data;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey,0x20,
             (allocator_type *)&format_data);
  if (net_type == kCustomChain) {
    written = 0;
    uncompressed = 0;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buf,0x26,
               (allocator_type *)&format_data);
    ret = wally_base58_to_bytes
                    ((wif->_M_dataplus)._M_p,1,
                     buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     CONCAT44(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish._4_4_,
                              buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish._0_4_) -
                     (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start,&written);
    if (ret != 0) {
      format_data.map_._M_t._M_impl._0_8_ =
           (long)
           "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_key.cpp"
           + 0x67;
      format_data.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x2c1;
      format_data.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x52623e;
      logger::warn<int&,std::__cxx11::string_const&>
                ((CfdSourceLocation *)&format_data,"wally_base58_to_bytes error. ret={} wif={}.",
                 &ret,wif);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)&format_data,"Error decode base58 WIF.",&local_fd);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&format_data);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ret = wally_wif_is_uncompressed((wif->_M_dataplus)._M_p,&uncompressed);
    if (ret != 0) {
      format_data.map_._M_t._M_impl._0_8_ =
           (long)
           "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_key.cpp"
           + 0x67;
      format_data.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x2c9;
      format_data.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x52623e;
      logger::warn<int&,std::__cxx11::string_const&>
                ((CfdSourceLocation *)&format_data,"wally_wif_is_uncompressed error. ret={} wif={}."
                 ,&ret,wif);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)&format_data,"Error WIF is uncompressed.",&local_fd);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&format_data);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    uVar1 = *buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    memcpy(privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,
           buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 1,
           (long)privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
    GetKeyFormatList();
    net_type = kCustomChain;
    for (; format_data.map_._M_t._M_impl._0_8_ !=
           CONCAT44(format_data.map_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                    format_data.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
        format_data.map_._M_t._M_impl._0_8_ = format_data.map_._M_t._M_impl._0_8_ + 0x78) {
      if (*(uchar *)(format_data.map_._M_t._M_impl._0_8_ + 0x31) == uVar1) {
        net_type = *(byte *)(format_data.map_._M_t._M_impl._0_8_ + 0x30) ^ kTestnet;
        break;
      }
    }
    ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::~vector
              ((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
               &format_data);
    if (format_data.map_._M_t._M_impl._0_8_ ==
        CONCAT44(format_data.map_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                 format_data.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color)) {
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&format_data,"Failed to parse WIF. unsupported WIF prefix.",&local_fd);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&format_data);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    is_compressed = uncompressed == 0;
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
    GetKeyFormatData(&format_data,net_type);
    iVar3 = wally_wif_to_bytes((wif->_M_dataplus)._M_p,(uint)format_data.wif_prefix_,
                               (uint)!is_compressed,
                               privkey.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,0x20);
    written = CONCAT44(written._4_4_,iVar3);
    if (iVar3 != 0) {
      buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_key.cpp";
      buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x2eb;
      buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "FromWif";
      logger::warn<int&,std::__cxx11::string_const&>
                ((CfdSourceLocation *)&buf,"wally_wif_to_bytes error. ret={} wif={}.",
                 (int *)&written,wif);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&buf,"Error WIF to Private key.",(allocator *)&uncompressed);
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&buf);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    KeyFormatData::~KeyFormatData(&format_data);
  }
  bVar2 = IsValid(&privkey);
  if (bVar2) {
    ByteData::ByteData((ByteData *)&format_data,&privkey);
    Privkey(__return_storage_ptr__,(ByteData *)&format_data,kMainnet,true);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&format_data);
    __return_storage_ptr__->is_compressed_ = is_compressed;
    __return_storage_ptr__->net_type_ = net_type;
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&privkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcore_key.cpp";
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x2f6;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "FromWif";
  ByteData::ByteData((ByteData *)&written,&privkey);
  ByteData::GetHex_abi_cxx11_((string *)&format_data,(ByteData *)&written);
  logger::warn<std::__cxx11::string>
            ((CfdSourceLocation *)&buf,"Invalid Privkey data. data={}",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&format_data);
  ::std::__cxx11::string::~string((string *)&format_data);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&written);
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&format_data,"Invalid Privkey data",(allocator *)&buf);
  CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&format_data);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Privkey Privkey::FromWif(
    const std::string &wif, NetType net_type, bool is_compressed) {
  std::vector<uint8_t> privkey(kPrivkeySize);
  NetType temp_net_type = net_type;
  bool is_temp_compressed = is_compressed;
  if (net_type == NetType::kCustomChain) {
    // auto analyze
    size_t written = 0;
    size_t uncompressed = 0;
    std::vector<uint8_t> buf(2 + EC_PRIVATE_KEY_LEN + BASE58_CHECKSUM_LEN);
    int ret = wally_base58_to_bytes(
        wif.data(), BASE58_FLAG_CHECKSUM, buf.data(), buf.size(), &written);
    if (ret != WALLY_OK) {
      warn(
          CFD_LOG_SOURCE, "wally_base58_to_bytes error. ret={} wif={}.", ret,
          wif);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Error decode base58 WIF.");
    }
    ret = wally_wif_is_uncompressed(wif.data(), &uncompressed);
    if (ret != WALLY_OK) {
      warn(
          CFD_LOG_SOURCE, "wally_wif_is_uncompressed error. ret={} wif={}.",
          ret, wif);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Error WIF is uncompressed.");
    }

    uint32_t prefix = buf[0];
    memcpy(privkey.data(), &buf[1], privkey.size());

    bool has_prefix = false;
    for (const auto &format : GetKeyFormatList()) {
      if (format.GetWifPrefix() == prefix) {
        temp_net_type = format.GetNetType();
        has_prefix = true;
        break;
      }
    }
    if (!has_prefix) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parse WIF. unsupported WIF prefix.");
    }
    is_temp_compressed = (uncompressed == 0) ? true : false;
  } else {
    auto format_data = GetKeyFormatData(net_type);
    uint32_t prefix = format_data.GetWifPrefix();
    uint32_t flags =
        (is_compressed ? WALLY_WIF_FLAG_COMPRESSED
                       : WALLY_WIF_FLAG_UNCOMPRESSED);

    int ret = wally_wif_to_bytes(
        wif.data(), prefix, flags, privkey.data(), kPrivkeySize);
    if (ret != WALLY_OK) {
      warn(
          CFD_LOG_SOURCE, "wally_wif_to_bytes error. ret={} wif={}.", ret,
          wif);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Error WIF to Private key.");
    }
    temp_net_type = net_type;
    is_temp_compressed = is_compressed;
  }

  if (!IsValid(privkey)) {
    warn(
        CFD_LOG_SOURCE, "Invalid Privkey data. data={}",
        ByteData(privkey).GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Privkey data");
  }
  Privkey key = Privkey(ByteData(privkey));
  key.SetPubkeyCompressed(is_temp_compressed);
  key.SetNetType(temp_net_type);
  return key;
}